

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void google::protobuf::internal::ExtensionSet::RegisterExtension
               (MessageLite *containing_type,int number,FieldType type,bool is_repeated,
               bool is_packed)

{
  ExtensionInfo info;
  LogMessage *pLVar1;
  undefined7 in_register_00000011;
  LogFinisher local_89;
  FieldType local_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined5 uStack_85;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  LogMessage local_68;
  
  if ((int)CONCAT71(in_register_00000011,type) == 0xe) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x73);
    pLVar1 = LogMessage::operator<<
                       (&local_68,"CHECK failed: (type) != (WireFormatLite::TYPE_ENUM): ");
    LogFinisher::operator=(&local_89,pLVar1);
  }
  else if (type == '\v') {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x74);
    pLVar1 = LogMessage::operator<<
                       (&local_68,"CHECK failed: (type) != (WireFormatLite::TYPE_MESSAGE): ");
    LogFinisher::operator=(&local_89,pLVar1);
  }
  else {
    if (type != '\n') goto LAB_00114320;
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x75);
    pLVar1 = LogMessage::operator<<
                       (&local_68,"CHECK failed: (type) != (WireFormatLite::TYPE_GROUP): ");
    LogFinisher::operator=(&local_89,pLVar1);
  }
  LogMessage::~LogMessage(&local_68);
LAB_00114320:
  uStack_70 = 0;
  info.is_repeated = is_repeated;
  info.type = type;
  info.is_packed = is_packed;
  info._3_5_ = uStack_85;
  info.field_3.enum_validity_check.func = (EnumValidityFuncWithArg *)uStack_80;
  info.field_3.enum_validity_check.arg = (void *)local_78;
  info.descriptor = (FieldDescriptor *)0x0;
  local_88 = type;
  uStack_87 = is_repeated;
  uStack_86 = is_packed;
  anon_unknown_0::Register(containing_type,number,info);
  return;
}

Assistant:

void ExtensionSet::RegisterExtension(const MessageLite* containing_type,
                                     int number, FieldType type,
                                     bool is_repeated, bool is_packed) {
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_ENUM);
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_MESSAGE);
  GOOGLE_CHECK_NE(type, WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(type, is_repeated, is_packed);
  Register(containing_type, number, info);
}